

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_code.cc
# Opt level: O0

void re2c::from_le(OutputFile *o,uint32_t ind,size_t size,char *expr)

{
  OutputFile *pOVar1;
  uint local_2c;
  uint32_t i;
  char *expr_local;
  size_t size_local;
  uint32_t ind_local;
  OutputFile *o_local;
  
  pOVar1 = OutputFile::ws(o,"\n");
  pOVar1 = OutputFile::wind(pOVar1,ind);
  OutputFile::ws(pOVar1,"/* from little-endian to host-endian */");
  pOVar1 = OutputFile::ws(o,"\n");
  pOVar1 = OutputFile::wind(pOVar1,ind);
  pOVar1 = OutputFile::ws(pOVar1,"unsigned char *p = (unsigned char*)&");
  pOVar1 = OutputFile::ws(pOVar1,expr);
  OutputFile::ws(pOVar1,";");
  pOVar1 = OutputFile::ws(o,"\n");
  pOVar1 = OutputFile::wind(pOVar1,ind);
  pOVar1 = OutputFile::ws(pOVar1,expr);
  OutputFile::ws(pOVar1," = p[0]");
  for (local_2c = 1; local_2c < size; local_2c = local_2c + 1) {
    pOVar1 = OutputFile::ws(o," + (p[");
    pOVar1 = OutputFile::wu32(pOVar1,local_2c);
    pOVar1 = OutputFile::ws(pOVar1,"] << ");
    pOVar1 = OutputFile::wu32(pOVar1,local_2c << 3);
    OutputFile::ws(pOVar1,"u)");
  }
  OutputFile::ws(o,";");
  return;
}

Assistant:

static void from_le(OutputFile &o, uint32_t ind, size_t size, const char *expr)
{
	o.ws("\n").wind(ind).ws("/* from little-endian to host-endian */");
	o.ws("\n").wind(ind).ws("unsigned char *p = (unsigned char*)&").ws(expr).ws(";");
	o.ws("\n").wind(ind).ws(expr).ws(" = p[0]");
	for (uint32_t i = 1; i < size; ++i)
	{
		o.ws(" + (p[").wu32(i).ws("] << ").wu32(i * 8).ws("u)");
	}
	o.ws(";");
}